

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_test_pri(REF_DBL (*xyz) [3],REF_BOOL *possible)

{
  int local_64;
  REF_INT i;
  REF_DBL crdot;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL dx;
  REF_DBL znorm;
  REF_DBL ynorm;
  REF_DBL xnorm;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_BOOL *possible_local;
  REF_DBL (*xyz_local) [3];
  
  *possible = 1;
  if (((xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 - ((*xyz)[2] + xyz[1][2] + xyz[2][2]) / 3.0) *
      ((xyz[1][0] - (*xyz)[0]) * (xyz[2][1] - (*xyz)[1]) +
      -((xyz[1][1] - (*xyz)[1]) * (xyz[2][0] - (*xyz)[0]))) * 0.5 +
      ((xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 - ((*xyz)[0] + xyz[1][0] + xyz[2][0]) / 3.0) *
      ((xyz[1][1] - (*xyz)[1]) * (xyz[2][2] - (*xyz)[2]) +
      -((xyz[1][2] - (*xyz)[2]) * (xyz[2][1] - (*xyz)[1]))) * 0.5 +
      ((xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 - ((*xyz)[1] + xyz[1][1] + xyz[2][1]) / 3.0) *
      ((xyz[1][0] - (*xyz)[0]) * (xyz[2][2] - (*xyz)[2]) +
      -((xyz[1][2] - (*xyz)[2]) * (xyz[2][0] - (*xyz)[0]))) * -0.5 < 0.0) {
    printf("bad pri base\n");
    *possible = 0;
  }
  if ((-(xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 + ((*xyz)[2] + xyz[1][2] + xyz[2][2]) / 3.0) *
      ((xyz[5][0] - xyz[3][0]) * (xyz[4][1] - xyz[3][1]) +
      -((xyz[5][1] - xyz[3][1]) * (xyz[4][0] - xyz[3][0]))) * 0.5 +
      (-(xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 + ((*xyz)[0] + xyz[1][0] + xyz[2][0]) / 3.0) *
      ((xyz[5][1] - xyz[3][1]) * (xyz[4][2] - xyz[3][2]) +
      -((xyz[5][2] - xyz[3][2]) * (xyz[4][1] - xyz[3][1]))) * 0.5 +
      (-(xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 + ((*xyz)[1] + xyz[1][1] + xyz[2][1]) / 3.0) *
      ((xyz[5][0] - xyz[3][0]) * (xyz[4][2] - xyz[3][2]) +
      -((xyz[5][2] - xyz[3][2]) * (xyz[4][0] - xyz[3][0]))) * -0.5 < 0.0) {
    printf("bad pri top\n");
    *possible = 0;
  }
  if (*possible == 0) {
    printf("zone t=\"bad\", nodes=6, elements=1, datapacking=point, zonetype=febrick");
    for (local_64 = 0; local_64 < 6; local_64 = local_64 + 1) {
      printf(" %.16e %.16e %.16e\n",xyz[local_64][0],xyz[local_64][1],xyz[local_64][2]);
    }
    printf(" 1 2 3 3 4 5 6 6\n");
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_test_pri(REF_DBL xyz[6][3],
                                              REF_BOOL *possible) {
  REF_INT n1, n2, n3;
  REF_DBL xnorm, ynorm, znorm;
  REF_DBL dx, dy, dz;
  REF_DBL crdot;

  REF_INT i;

  *possible = REF_TRUE;

  n1 = 0;
  n2 = 1;
  n3 = 2;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = (xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 -
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = (xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 -
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = (xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 -
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri base\n");
    *possible = REF_FALSE;
  }

  n1 = 3;
  n2 = 5;
  n3 = 4;

  xnorm = 0.5 * ((xyz[n2][1] - xyz[n1][1]) * (xyz[n3][2] - xyz[n1][2]) -
                 (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][1] - xyz[n1][1]));
  ynorm = -0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][2] - xyz[n1][2]) -
                  (xyz[n2][2] - xyz[n1][2]) * (xyz[n3][0] - xyz[n1][0]));
  znorm = 0.5 * ((xyz[n2][0] - xyz[n1][0]) * (xyz[n3][1] - xyz[n1][1]) -
                 (xyz[n2][1] - xyz[n1][1]) * (xyz[n3][0] - xyz[n1][0]));

  dx = -(xyz[3][0] + xyz[4][0] + xyz[5][0]) / 3.0 +
       (xyz[0][0] + xyz[1][0] + xyz[2][0]) / 3.0;
  dy = -(xyz[3][1] + xyz[4][1] + xyz[5][1]) / 3.0 +
       (xyz[0][1] + xyz[1][1] + xyz[2][1]) / 3.0;
  dz = -(xyz[3][2] + xyz[4][2] + xyz[5][2]) / 3.0 +
       (xyz[0][2] + xyz[1][2] + xyz[2][2]) / 3.0;

  crdot = dx * xnorm + dy * ynorm + dz * znorm;

  if (crdot < 0.0) {
    printf("bad pri top\n");
    *possible = REF_FALSE;
  }

  if (!*possible) {
    printf(
        "zone t=\"bad\", nodes=6, elements=1, datapacking=point, "
        "zonetype=febrick");
    for (i = 0; i < 6; i++)
      printf(" %.16e %.16e %.16e\n", xyz[i][0], xyz[i][1], xyz[i][2]);
    printf(" 1 2 3 3 4 5 6 6\n");
  }

  return REF_SUCCESS;
}